

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

DFA<covenant::Sym> *
covenant::witness_impl::to_automata<covenant::Sym>
          (DFA<covenant::Sym> *__return_storage_ptr__,witness_t *witness,TermFactory *tfac)

{
  State SVar1;
  State SVar2;
  pointer piVar3;
  pointer piVar4;
  socklen_t *psVar5;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_00;
  DFA<covenant::Sym> *dfa;
  State unaff_EBP;
  State unaff_R12D;
  uint i;
  int i_00;
  uint local_60;
  Sym local_5c;
  sockaddr *local_58;
  TermFactory local_50;
  TermFactory local_40;
  
  psVar5 = (socklen_t *)
           (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_50.px = tfac->px;
  if (psVar5 == (socklen_t *)
                (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    local_40.pn.pi_ = (tfac->pn).pi_;
    if (local_40.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_40.pn.pi_)->use_count_ = (local_40.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_40.px = local_50.px;
    DFA<covenant::Sym>::DFA(__return_storage_ptr__,&local_40);
    boost::detail::shared_count::~shared_count(&local_40.pn);
    SVar2 = DFA<covenant::Sym>::state(__return_storage_ptr__,0);
    SVar1 = DFA<covenant::Sym>::state(__return_storage_ptr__,1);
    __return_storage_ptr__->start = SVar2.id;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,SVar1.id,__addr_00,psVar5);
  }
  else {
    local_50.pn.pi_ = (tfac->pn).pi_;
    if (local_50.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_50.pn.pi_)->use_count_ = (local_50.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    DFA<covenant::Sym>::DFA(__return_storage_ptr__,&local_50);
    boost::detail::shared_count::~shared_count(&local_50.pn);
    piVar4 = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __addr = (sockaddr *)((ulong)((long)piVar3 - (long)piVar4) >> 2);
    psVar5 = (socklen_t *)0x0;
    local_58 = __addr;
    while (i_00 = (int)psVar5, psVar5 <= (socklen_t *)((long)piVar3 - (long)piVar4 >> 2)) {
      SVar1 = DFA<covenant::Sym>::state(__return_storage_ptr__,i_00);
      __addr = extraout_RDX;
      SVar2 = SVar1;
      if (i_00 != 0) {
        local_5c.x = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[i_00 - 1] * 2;
        DFA<covenant::Sym>::transition(__return_storage_ptr__,unaff_R12D,&local_5c,SVar1);
        __addr = extraout_RDX_00;
        SVar2.id = local_60;
        if ((int)local_58 == i_00) {
          unaff_EBP = SVar1;
        }
      }
      local_60 = SVar2.id;
      piVar4 = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      unaff_R12D = SVar1;
      psVar5 = (socklen_t *)(ulong)(i_00 + 1);
    }
    __return_storage_ptr__->start = local_60;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,unaff_EBP.id,__addr,psVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

DFA<EdgeSym> to_automata(const witness_t &witness, TermFactory tfac)
  {
    if (witness.empty())
    {
      DFA<EdgeSym> dfa (tfac);
      State start = dfa.state(0);
      State final = dfa.state(1);
      dfa.setStart(start);
      dfa.accept(final);
      return dfa;
    }

    DFA<EdgeSym> dfa (tfac);
    State start, final;
    State prev , curr;
    unsigned n = witness.size();
    for(unsigned i=0; i<= witness.size(); i++)
    {
      curr = dfa.state(i);
      if (i == 0)
        start = curr;
      else
      {
        if (i == n)
        {
          final = curr;
        }
        dfa.transition(prev, EdgeSym::mkTerm(witness[i-1]), curr);
      }
      prev = curr;
    }
    dfa.setStart(start);
    dfa.accept(final);
    return dfa;
  }